

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O0

void __thiscall
Database_GetStartPastLogicalEOF_Test::Database_GetStartPastLogicalEOF_Test
          (Database_GetStartPastLogicalEOF_Test *this)

{
  Database_GetStartPastLogicalEOF_Test *this_local;
  
  anon_unknown.dwarf_426e3::Database::Database(&this->super_Database);
  (this->super_Database).super_Test._vptr_Test =
       (_func_int **)&PTR__Database_GetStartPastLogicalEOF_Test_003cd7b8;
  return;
}

Assistant:

TEST_F (Database, GetStartPastLogicalEOF) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto const addr = pstore::address{db.size () + 1};
    constexpr std::size_t size = 1;
    check_for_error ([&db, addr, size] () { db.getro (addr, size); },
                     pstore::error_code::bad_address);
    check_for_error ([&db, addr, size] () { db.getrou (addr, size); },
                     pstore::error_code::bad_address);
}